

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_abo(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  type_info *ptVar2;
  numeric *this_00;
  numeric *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *this_01;
  any *in_RCX;
  allocator local_39;
  string local_38;
  
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&numeric::typeinfo);
    if (bVar1) {
      this_00 = cs_impl::any::const_val<cs::numeric>(b);
      rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
      local_38._M_dataplus._M_p._0_1_ = numeric::operator>(this_00,rhs);
      goto LAB_002a5744;
    }
  }
  ptVar2 = cs_impl::any::type(b);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    ptVar2 = cs_impl::any::type(in_RCX);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::__cxx11::string::typeinfo);
    if (bVar1) {
      __lhs = cs_impl::any::const_val<std::__cxx11::string>(b);
      __rhs = cs_impl::any::const_val<std::__cxx11::string>(in_RCX);
      local_38._M_dataplus._M_p._0_1_ = std::operator>(__lhs,__rhs);
LAB_002a5744:
      cs_impl::any::any<bool>((any *)this,(bool *)&local_38);
      return (var)(proxy *)this;
    }
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Unsupported operator operations(Abo).",&local_39);
  runtime_error::runtime_error(this_01,&local_38);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_abo(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return boolean(a.const_val<numeric>() > b.const_val<numeric>());
		else if (a.type() == typeid(string) && b.type() == typeid(string))
			return boolean(a.const_val<string>() > b.const_val<string>());
		else
			throw runtime_error("Unsupported operator operations(Abo).");
	}